

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O0

bool test::ValidatePreconnectData(uint channel,uint8_t *data,uint bytes)

{
  uint i;
  uint bytes_local;
  uint8_t *data_local;
  uint channel_local;
  bool local_1;
  
  if ((bytes == 10) && (channel == 0x37)) {
    for (i = 0; i < 10; i = i + 1) {
      if (data[i] != PreConnectData[i]) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ValidatePreconnectData(unsigned channel, const uint8_t* data, unsigned bytes)
{
    if (bytes != kPreConnectDataBytes || channel != kPreConnectChannel)
        return false;

    for (unsigned i = 0; i < kPreConnectDataBytes; ++i)
        if (data[i] != PreConnectData[i])
            return false;

    return true;
}